

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
::find_position<HashObject<4,4>>
          (dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
           *this,HashObject<4,_4> *key)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  
  g_num_hashes = g_num_hashes + 1;
  uVar1 = *(long *)(this + 0x38) - 1U & (long)key->i_;
  iVar3 = *(int *)(*(long *)(this + 0x48) + uVar1 * 8);
  uVar2 = uVar1;
  if (*(int *)(this + 0x24) != iVar3) {
    uVar4 = 0xffffffffffffffff;
    lVar5 = 1;
    do {
      if ((*(long *)(this + 0x28) == 0) || (*(int *)(this + 0x20) != iVar3)) {
        if (key->i_ == iVar3) {
          uVar2 = 0xffffffffffffffff;
          goto LAB_0012b07f;
        }
      }
      else if (uVar4 == 0xffffffffffffffff) {
        uVar4 = uVar1;
      }
      uVar1 = uVar1 + lVar5 & *(long *)(this + 0x38) - 1U;
      iVar3 = *(int *)(*(long *)(this + 0x48) + uVar1 * 8);
      lVar5 = lVar5 + 1;
    } while (*(int *)(this + 0x24) != iVar3);
    uVar2 = uVar1;
    if (uVar4 != 0xffffffffffffffff) {
      uVar2 = uVar4;
    }
  }
  uVar1 = 0xffffffffffffffff;
LAB_0012b07f:
  pVar6.second = uVar2;
  pVar6.first = uVar1;
  return pVar6;
}

Assistant:

size_type bucket_count() const { return num_buckets; }